

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initgamedialog.cpp
# Opt level: O0

void __thiscall InitGameDialog::InitGameDialog(InitGameDialog *this,QWidget *parent)

{
  InitGameDialog *pIVar1;
  QObject local_38 [28];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  InitGameDialog *this_local;
  
  local_18 = parent;
  parent_local = (QWidget *)this;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QDialog::QDialog(&this->super_QDialog,parent,(QFlags_conflict *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00118850;
  *(undefined ***)&this->field_0x10 = &PTR__InitGameDialog_00118a28;
  pIVar1 = (InitGameDialog *)operator_new(0x40);
  this->ui = pIVar1;
  Ui_InitGameDialog::setupUi((Ui_InitGameDialog *)this->ui,&this->super_QDialog);
  QObject::connect<void(QDialogButtonBox::*)(),InitGameDialog::InitGameDialog(QWidget*)::__0>
            (local_38,*(Object **)(this->ui + 0x28),
             (offset_in_QDialogButtonBox_to_subr)QDialogButtonBox::accepted,
             (anon_class_8_1_8991fb9c_for_function)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

InitGameDialog::InitGameDialog(QWidget *parent) :
    QDialog(parent),
    ui(new Ui::InitGameDialog)
{
    ui->setupUi(this);
//    ui->player1Label->setBuddy()
    connect(ui->buttonBox, &QDialogButtonBox::accepted, [this](){emit sendPlayerNames("foo", "bar");});

}